

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

bool google::protobuf::internal::WireFormat::SkipField
               (CodedInputStream *input,uint32_t tag,UnknownFieldSet *unknown_fields)

{
  CodedInputStream *pCVar1;
  bool bVar2;
  WireType WVar3;
  int field_number;
  uint32_t expected;
  string *buffer;
  UnknownFieldSet *local_68;
  uint32_t local_48;
  uint32_t local_44;
  uint32_t value_2;
  uint32_t length;
  uint64_t value_1;
  uint64_t value;
  UnknownFieldSet *pUStack_28;
  int number;
  UnknownFieldSet *unknown_fields_local;
  CodedInputStream *pCStack_18;
  uint32_t tag_local;
  CodedInputStream *input_local;
  
  pUStack_28 = unknown_fields;
  unknown_fields_local._4_4_ = tag;
  pCStack_18 = input;
  value._4_4_ = WireFormatLite::GetTagFieldNumber(tag);
  if (value._4_4_ == 0) {
    input_local._7_1_ = false;
  }
  else {
    WVar3 = WireFormatLite::GetTagWireType(unknown_fields_local._4_4_);
    switch(WVar3) {
    case WIRETYPE_VARINT:
      bVar2 = io::CodedInputStream::ReadVarint64(pCStack_18,&value_1);
      if (bVar2) {
        if (pUStack_28 != (UnknownFieldSet *)0x0) {
          UnknownFieldSet::AddVarint(pUStack_28,value._4_4_,value_1);
        }
        input_local._7_1_ = true;
      }
      else {
        input_local._7_1_ = false;
      }
      break;
    case WIRETYPE_FIXED64:
      bVar2 = io::CodedInputStream::ReadLittleEndian64(pCStack_18,(uint64_t *)&value_2);
      if (bVar2) {
        if (pUStack_28 != (UnknownFieldSet *)0x0) {
          UnknownFieldSet::AddFixed64(pUStack_28,value._4_4_,_value_2);
        }
        input_local._7_1_ = true;
      }
      else {
        input_local._7_1_ = false;
      }
      break;
    case WIRETYPE_LENGTH_DELIMITED:
      bVar2 = io::CodedInputStream::ReadVarint32(pCStack_18,&local_44);
      pCVar1 = pCStack_18;
      if (bVar2) {
        if (pUStack_28 == (UnknownFieldSet *)0x0) {
          bVar2 = io::CodedInputStream::Skip(pCStack_18,local_44);
          if (!bVar2) {
            return false;
          }
        }
        else {
          buffer = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(pUStack_28,value._4_4_);
          bVar2 = io::CodedInputStream::ReadString(pCVar1,buffer,local_44);
          if (!bVar2) {
            return false;
          }
        }
        input_local._7_1_ = true;
      }
      else {
        input_local._7_1_ = false;
      }
      break;
    case WIRETYPE_START_GROUP:
      bVar2 = io::CodedInputStream::IncrementRecursionDepth(pCStack_18);
      pCVar1 = pCStack_18;
      if (bVar2) {
        if (pUStack_28 == (UnknownFieldSet *)0x0) {
          local_68 = (UnknownFieldSet *)0x0;
        }
        else {
          local_68 = UnknownFieldSet::AddGroup(pUStack_28,value._4_4_);
        }
        bVar2 = SkipMessage(pCVar1,local_68);
        if (bVar2) {
          io::CodedInputStream::DecrementRecursionDepth(pCStack_18);
          pCVar1 = pCStack_18;
          field_number = WireFormatLite::GetTagFieldNumber(unknown_fields_local._4_4_);
          expected = WireFormatLite::MakeTag(field_number,WIRETYPE_END_GROUP);
          bVar2 = io::CodedInputStream::LastTagWas(pCVar1,expected);
          if (bVar2) {
            input_local._7_1_ = true;
          }
          else {
            input_local._7_1_ = false;
          }
        }
        else {
          input_local._7_1_ = false;
        }
      }
      else {
        input_local._7_1_ = false;
      }
      break;
    case WIRETYPE_END_GROUP:
      input_local._7_1_ = false;
      break;
    case WIRETYPE_FIXED32:
      bVar2 = io::CodedInputStream::ReadLittleEndian32(pCStack_18,&local_48);
      if (bVar2) {
        if (pUStack_28 != (UnknownFieldSet *)0x0) {
          UnknownFieldSet::AddFixed32(pUStack_28,value._4_4_,local_48);
        }
        input_local._7_1_ = true;
      }
      else {
        input_local._7_1_ = false;
      }
      break;
    default:
      input_local._7_1_ = false;
    }
  }
  return input_local._7_1_;
}

Assistant:

bool WireFormat::SkipField(io::CodedInputStream* input, uint32_t tag,
                           UnknownFieldSet* unknown_fields) {
  int number = WireFormatLite::GetTagFieldNumber(tag);
  // Field number 0 is illegal.
  if (number == 0) return false;

  switch (WireFormatLite::GetTagWireType(tag)) {
    case WireFormatLite::WIRETYPE_VARINT: {
      uint64_t value;
      if (!input->ReadVarint64(&value)) return false;
      if (unknown_fields != nullptr) unknown_fields->AddVarint(number, value);
      return true;
    }
    case WireFormatLite::WIRETYPE_FIXED64: {
      uint64_t value;
      if (!input->ReadLittleEndian64(&value)) return false;
      if (unknown_fields != nullptr) unknown_fields->AddFixed64(number, value);
      return true;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      uint32_t length;
      if (!input->ReadVarint32(&length)) return false;
      if (unknown_fields == nullptr) {
        if (!input->Skip(length)) return false;
      } else {
        if (!input->ReadString(unknown_fields->AddLengthDelimited(number),
                               length)) {
          return false;
        }
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      if (!input->IncrementRecursionDepth()) return false;
      if (!SkipMessage(input, (unknown_fields == nullptr)
                                  ? nullptr
                                  : unknown_fields->AddGroup(number))) {
        return false;
      }
      input->DecrementRecursionDepth();
      // Check that the ending tag matched the starting tag.
      if (!input->LastTagWas(
              WireFormatLite::MakeTag(WireFormatLite::GetTagFieldNumber(tag),
                                      WireFormatLite::WIRETYPE_END_GROUP))) {
        return false;
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      return false;
    }
    case WireFormatLite::WIRETYPE_FIXED32: {
      uint32_t value;
      if (!input->ReadLittleEndian32(&value)) return false;
      if (unknown_fields != nullptr) unknown_fields->AddFixed32(number, value);
      return true;
    }
    default: {
      return false;
    }
  }
}